

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O2

void __thiscall mocker::LoopInvariantCodeMotion::insertPreHeaders(LoopInvariantCodeMotion *this)

{
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *puVar1;
  FunctionModule *pFVar2;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *ppVar3;
  uint __line;
  bool bVar4;
  mapped_type *pmVar5;
  BBLIter BVar6;
  BasicBlock *pBVar7;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  __node_base *p_Var8;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *__args;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
  *this_00;
  char *__assertion;
  InstList *pIVar9;
  _List_node_base *p_Var10;
  __node_base *p_Var11;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>,_bool>
  pVar12;
  unsigned_long header;
  BasicBlock *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  __shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> local_1a8 [2];
  shared_ptr<mocker::ir::Phi> phi;
  pair<std::shared_ptr<mocker::ir::Phi>,_std::shared_ptr<mocker::ir::Phi>_> local_178;
  BasicBlock *local_150;
  __node_base *local_148;
  LoopInvariantCodeMotion *local_140;
  shared_ptr<mocker::ir::Reg> local_138;
  shared_ptr<mocker::ir::Reg> preHeaderPhiDest;
  undefined1 local_118 [16];
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  optionMoved;
  __shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  optionLeft;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  outerPreds;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  Preds;
  
  buildBlockPredecessors(&Preds,(this->super_FuncPass).func);
  p_Var11 = &(this->loopTree).loops._M_h._M_before_begin;
  puVar1 = &this->preHeaders;
  local_140 = this;
  do {
    do {
      p_Var11 = p_Var11->_M_nxt;
      if (p_Var11 == (__node_base *)0x0) {
        removeDeletedInsts((this->super_FuncPass).func);
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&Preds._M_h);
        return;
      }
      header = *(unsigned_long *)(p_Var11 + 1);
    } while (p_Var11[5]._M_nxt == (_Hash_node_base *)0x1);
    local_148 = p_Var11;
    pmVar5 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&Preds,&header);
    local_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (pmVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
    pmVar5 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&Preds,&header);
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&outerPreds,local_1b0,
               (pmVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish,0,local_1a8,&local_178,
               (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                *)&optionLeft);
    p_Var11 = local_148;
    subSet<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
              (&outerPreds,
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)(local_148 + 2));
    pFVar2 = (this->super_FuncPass).func;
    if ((_List_node_base *)p_Var11[1]._M_nxt !=
        (pFVar2->bbs).
        super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
        _M_node.super__List_node_base._M_next[1]._M_next) {
      if (outerPreds._M_h._M_element_count == 0) {
        __assertion = "!outerPreds.empty()";
        __line = 0x3c;
LAB_001101d8:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp"
                      ,__line,"void mocker::LoopInvariantCodeMotion::insertPreHeaders()");
      }
      local_150 = ir::FunctionModule::getMutableBasicBlock(pFVar2,header);
      BVar6 = ir::FunctionModule::pushBackBB((this->super_FuncPass).func);
      local_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)BVar6._M_node[1]._M_next;
      local_1a8[0]._M_ptr = (element_type *)header;
      local_1a8[0]._M_refcount._M_pi = local_1b0;
      pVar12 = std::
               _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::_M_emplace<std::pair<unsigned_long,unsigned_long>>
                         ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)puVar1,local_1a8);
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __assertion = "tmp";
        __line = 0x43;
        goto LAB_001101d8;
      }
      local_1b8 = (BasicBlock *)(BVar6._M_node + 1);
      p_Var8 = &outerPreds._M_h._M_before_begin;
      while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
        pBVar7 = ir::FunctionModule::getMutableBasicBlock
                           ((this->super_FuncPass).func,(size_t)p_Var8[1]._M_nxt);
        p_Var10 = (pBVar7->insts).
                  super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1;
        replaceTerminatorLabel((shared_ptr<mocker::ir::IRInst> *)local_1a8,(size_t)p_Var10,header);
        std::__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)p_Var10,local_1a8
                  );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8[0]._M_refcount);
      }
      pIVar9 = &local_150->insts;
      pBVar7 = local_1b8;
      p_Var10 = (_List_node_base *)pIVar9;
      while (p_Var10 = (((_List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                          *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var10 != (_List_node_base *)pIVar9) {
        ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>
                  ((ir *)&phi,(shared_ptr<mocker::ir::IRInst> *)(p_Var10 + 1));
        if (phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          break;
        }
        pFVar2 = (this->super_FuncPass).func;
        optionLeft.
        super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        optionMoved.
        super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        optionLeft.
        super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        optionLeft.
        super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        optionMoved.
        super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        optionMoved.
        super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ppVar3 = ((phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 options).
                 super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__args = ((phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->options).
                      super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; __args != ppVar3;
            __args = __args + 1) {
          local_1a8[0]._M_ptr =
               (element_type *)
               ((__args->second).super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->id;
          bVar4 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                            (&outerPreds,(unsigned_long *)local_1a8);
          this_00 = (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                     *)&optionLeft;
          if (bVar4) {
            this_00 = (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                       *)&optionMoved;
          }
          std::
          vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
          ::
          emplace_back<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>const&>
                    (this_00,__args);
        }
        if (optionMoved.
            super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            optionMoved.
            super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2> *)&local_178,
                     &phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>);
          local_178.second.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_178.second.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pBVar7 = local_1b8;
          this = local_140;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1a8,"",(allocator<char> *)&local_138);
          this = local_140;
          pBVar7 = local_1b8;
          ir::FunctionModule::makeTempLocalReg
                    ((FunctionModule *)&preHeaderPhiDest,&pFVar2->identifier);
          std::__cxx11::string::~string((string *)local_1a8);
          std::make_shared<mocker::ir::Label,unsigned_long_const&>((unsigned_long *)local_1a8);
          std::
          vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
          ::emplace_back<std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Label>>
                    ((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                      *)&optionLeft,&preHeaderPhiDest,(shared_ptr<mocker::ir::Label> *)local_1a8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_1a8[0]._M_refcount);
          std::
          make_shared<mocker::ir::Phi,std::shared_ptr<mocker::ir::Reg>const&,std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>&>
                    ((shared_ptr<mocker::ir::Reg> *)local_1a8,
                     (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                      *)&((phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->super_Definition).dest);
          std::
          make_shared<mocker::ir::Phi,std::shared_ptr<mocker::ir::Reg>&,std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>&>
                    (&local_138,
                     (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                      *)&preHeaderPhiDest);
          local_178.first.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_1a8[0]._M_ptr;
          local_178.first.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_1a8[0]._M_refcount._M_pi;
          local_1a8[0]._M_ptr = (element_type *)0x0;
          local_1a8[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_178.second.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_138.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_178.second.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               local_138.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
          local_138.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_138.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_138.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_1a8[0]._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&preHeaderPhiDest.
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        std::
        vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
        ::~vector(&optionMoved);
        std::
        vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
        ::~vector(&optionLeft);
        if (local_178.second.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::ir::Phi,void>
                    (local_c8,&local_178.second.
                               super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>);
          ir::BasicBlock::appendInst(local_1b8,(shared_ptr<mocker::ir::IRInst> *)local_c8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
          std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)(p_Var10 + 1),
                     (__shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2> *)&local_178);
          pBVar7 = local_1b8;
        }
        std::pair<std::shared_ptr<mocker::ir::Phi>,_std::shared_ptr<mocker::ir::Phi>_>::~pair
                  (&local_178);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
      }
      std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_178);
      std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>>
                ((shared_ptr<mocker::ir::Label> *)local_1a8);
      p_Var11 = local_148;
      local_118._0_8_ = local_1a8[0]._M_ptr;
      local_118._8_8_ = local_1a8[0]._M_refcount._M_pi;
      local_1a8[0]._M_ptr = (element_type *)0x0;
      local_1a8[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ir::BasicBlock::appendInst(pBVar7,(shared_ptr<mocker::ir::IRInst> *)local_118);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8[0]._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_178.first.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      simplifyPhiFunctions(local_150);
      simplifyPhiFunctions(pBVar7);
    }
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&outerPreds._M_h);
  } while( true );
}

Assistant:

void LoopInvariantCodeMotion::insertPreHeaders() {
  const auto Preds = buildBlockPredecessors(func);

  for (auto &kv : loopTree.getLoops()) {
    auto header = kv.first;
    auto &loopNodes = kv.second;
    if (loopNodes.size() == 1) // is not a loop header
      continue;
    std::unordered_set<std::size_t> outerPreds(Preds.at(header).begin(),
                                               Preds.at(header).end());
    subSet(outerPreds, loopNodes);

    if (kv.first == func.getFirstBBLabel())
      continue;

    assert(!outerPreds.empty());

    // Insert a pre-header. Be careful with the phi-functions
    auto &headBB = func.getMutableBasicBlock(header);
    auto &preHeaderBB = *func.pushBackBB();
    auto preHeader = preHeaderBB.getLabelID();
    auto tmp = preHeaders.emplace(std::make_pair(header, preHeader)).second;
    assert(tmp);

    // adjust the terminators of the outer predecessors
    for (auto &pred : outerPreds) {
      auto &bb = func.getMutableBasicBlock(pred);
      auto &terminator = bb.getMutableInsts().back();
      terminator = replaceTerminatorLabel(terminator, header, preHeader);
    }

    // adjust the phi-functions
    for (auto &inst : headBB.getMutableInsts()) {
      const auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        break;
      auto newPhis = splitPhi(func, phi, outerPreds, preHeader);
      if (newPhis.second) {
        preHeaderBB.appendInst(newPhis.second);
        inst = newPhis.first;
      }
    }
    preHeaderBB.appendInst(
        std::make_shared<ir::Jump>(std::make_shared<ir::Label>(header)));
    simplifyPhiFunctions(headBB);
    simplifyPhiFunctions(preHeaderBB);
  }
  removeDeletedInsts(func);
}